

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

ly_set * lyd_find_xpath(lyd_node *data,char *expr)

{
  int iVar1;
  ly_set *set;
  LY_ERR *pLVar2;
  lys_module *plVar3;
  ushort uVar4;
  undefined1 auStack_58 [8];
  lyxp_set xp_set;
  
  if (data == (lyd_node *)0x0 || expr == (char *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    set = (ly_set *)0x0;
  }
  else {
    xp_set.val._8_8_ = 0;
    xp_set.used = 0;
    xp_set.size = 0;
    xp_set._8_8_ = 0;
    xp_set.val.nodes = (lyxp_set_nodes *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    xp_set.type = LYXP_SET_EMPTY;
    xp_set._4_4_ = 0;
    plVar3 = data->schema->module;
    if ((plVar3->field_0x40 & 1) != 0) {
      plVar3 = (lys_module *)plVar3->data;
    }
    set = (ly_set *)0x0;
    iVar1 = lyxp_eval(expr,data,LYXP_NODE_ELEM,plVar3,(lyxp_set *)auStack_58,0);
    if (iVar1 == 0) {
      set = ly_set_new();
      if (set == (ly_set *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        set = (ly_set *)0x0;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_find_xpath");
      }
      else {
        if (auStack_58._0_4_ == LYXP_SET_NODE_SET) {
          for (uVar4 = 0; (uint)uVar4 < (uint)xp_set.val._8_4_; uVar4 = uVar4 + 1) {
            if (*(int *)(xp_set._8_8_ + 8 + (ulong)uVar4 * 0x10) == 2) {
              iVar1 = ly_set_add(set,*(void **)(xp_set._8_8_ + (ulong)uVar4 * 0x10),1);
              if (iVar1 < 0) {
                ly_set_free(set);
                set = (ly_set *)0x0;
                break;
              }
            }
          }
        }
        lyxp_set_cast((lyxp_set *)auStack_58,LYXP_SET_EMPTY,data,(lys_module *)0x0,0);
      }
    }
  }
  return set;
}

Assistant:

ly_set *
lyd_find_xpath(const struct lyd_node *data, const char *expr)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    uint16_t i;

    if (!data || !expr) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(expr, data, LYXP_NODE_ELEM, lyd_node_module(data), &xp_set, 0) != EXIT_SUCCESS) {
        return NULL;
    }

    set = ly_set_new();
    if (!set) {
        LOGMEM;
        return NULL;
    }

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, data, NULL, 0);

    return set;
}